

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O0

bool __thiscall phyr::AccelBVH::intersectRay(AccelBVH *this,Ray *ray,SurfaceInteraction *si)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  element_type *peVar4;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  LinearBVHNode *node;
  int i;
  int itrIdx;
  int stackSize;
  int nodeStack [64];
  int isDirNeg [3];
  Vector3f invDir;
  bool intersected;
  int local_154;
  int local_150;
  int local_14c;
  int aiStack_148 [6];
  int *in_stack_fffffffffffffed0;
  Vector3<double> *in_stack_fffffffffffffed8;
  Ray *in_stack_fffffffffffffee0;
  Bounds3<double> *in_stack_fffffffffffffee8;
  uint local_44 [3];
  Vector3<double> local_38;
  byte local_19;
  undefined8 local_18;
  long local_10;
  
  local_19 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  Vector3<double>::Vector3
            (&local_38,1.0 / *(double *)(in_RSI + 0x18),1.0 / *(double *)(in_RSI + 0x20),
             1.0 / *(double *)(in_RSI + 0x28));
  local_44[0] = (uint)(local_38.x < 0.0);
  local_44[1] = (uint)(local_38.y < 0.0);
  local_44[2] = (uint)(local_38.z < 0.0);
  local_14c = 0;
  local_150 = 0;
  while( true ) {
    while( true ) {
      lVar3 = *(long *)(in_RDI + 0x28) + (long)local_150 * 0x38;
      bVar1 = Bounds3<double>::intersectRay
                        (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                         in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      if (!bVar1) break;
      if (*(short *)(lVar3 + 0x34) == 0) {
        if (local_44[*(byte *)(lVar3 + 0x36)] == 0) {
          aiStack_148[local_14c] = *(int *)(lVar3 + 0x30);
          local_150 = local_150 + 1;
        }
        else {
          aiStack_148[local_14c] = local_150 + 1;
          local_150 = *(int *)(lVar3 + 0x30);
        }
        local_14c = local_14c + 1;
      }
      else {
        for (local_154 = 0; local_154 < (int)(uint)*(ushort *)(lVar3 + 0x34);
            local_154 = local_154 + 1) {
          std::
          vector<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>::
          operator[]((vector<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
                      *)(in_RDI + 0x10),(long)(*(int *)(lVar3 + 0x30) + local_154));
          peVar4 = std::__shared_ptr_access<phyr::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<phyr::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x19a773);
          uVar2 = (*peVar4->_vptr_Object[4])(peVar4,local_10,local_18);
          if ((uVar2 & 1) != 0) {
            local_19 = 1;
          }
        }
        if (local_14c == 0) goto LAB_0019a854;
        local_14c = local_14c + -1;
        local_150 = aiStack_148[local_14c];
      }
    }
    if (local_14c == 0) break;
    local_14c = local_14c + -1;
    local_150 = aiStack_148[local_14c];
  }
LAB_0019a854:
  return (bool)(local_19 & 1);
}

Assistant:

bool AccelBVH::intersectRay(const Ray& ray, SurfaceInteraction* si) const {
    bool intersected = false;
    // Initialize ray intersection parameters
    Vector3f invDir(1 / ray.d.x, 1 / ray.d.y, 1 / ray.d.z);
    int isDirNeg[3] = { invDir.x < 0, invDir.y < 0, invDir.z < 0 };

    // Test against each BVH node
    int nodeStack[64];
    int stackSize = 0, itrIdx = 0, i;

    while (true) {
        const LinearBVHNode* node = &bvhNodes[itrIdx];
        // Inspect current node
        if (node->bounds.intersectRay(ray, invDir, isDirNeg)) {
            if (node->nObjects > 0) {
                // Node is leaf. Test against all objects in leaf
                for (i = 0; i < node->nObjects; i++)
                    if (objectList[node->objectStartIdx + i]->intersectRay(ray, si))
                        intersected = true;
                if (stackSize == 0) break;
                itrIdx = nodeStack[--stackSize];
            } else {
                // Internal node. Test near nodes first. Put far nodes in the stack
                if (isDirNeg[node->splitAxis]) {
                    // Stash first child and inspect second child first
                    nodeStack[stackSize++] = itrIdx + 1;
                    itrIdx = node->secondChildIdx;
                } else {
                    // Stash second child and inspect first child first
                    nodeStack[stackSize++] = node->secondChildIdx;
                    itrIdx++;
                }
            }
        } else {
            if (stackSize == 0) break;
            itrIdx = nodeStack[--stackSize];
        }
    }

    return intersected;
}